

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O1

void TPZShapeHDiv<pzshape::TPZShapeCube>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  long *plVar1;
  int *piVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  TPZVec<int> *pTVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  TPZManVector<int,_27> scalarOrders;
  undefined8 local_160;
  undefined8 local_158;
  undefined1 local_150 [8];
  undefined1 local_148 [16];
  ulong local_138;
  undefined8 local_130;
  int aiStack_128 [26];
  undefined1 local_c0 [16];
  ulong uStack_b0;
  ulong local_a8;
  int local_a0 [28];
  long lVar12;
  
  local_148 = (undefined1  [16])0x0;
  local_138 = 0;
  local_150 = (undefined1  [8])&PTR__TPZManVector_01840b58;
  uVar9 = ids->fNElements;
  local_158 = connectorders;
  if ((long)uVar9 < 9) {
    local_148._0_8_ = &local_130;
    local_138 = 0;
  }
  else {
    local_148._0_8_ = operator_new__(-(ulong)(uVar9 >> 0x3d != 0) | uVar9 * 8);
    local_138 = uVar9;
  }
  if (0 < (long)uVar9) {
    plVar1 = ids->fStore;
    uVar7 = 0;
    do {
      *(long *)(local_148._0_8_ + uVar7 * 8) = plVar1[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar9 != uVar7);
  }
  local_148._8_8_ = uVar9;
  TPZManVector<long,_8>::operator=(&data->fCornerNodeIds,(TPZManVector<long,_8> *)local_150);
  if ((undefined8 *)local_148._0_8_ == &local_130) {
    local_148._0_8_ = (long *)0x0;
  }
  local_138 = 0;
  local_150 = (undefined1  [8])&PTR__TPZVec_0183b5f0;
  if ((long *)local_148._0_8_ != (long *)0x0) {
    operator_delete__((void *)local_148._0_8_);
  }
  local_148 = (undefined1  [16])0x0;
  local_138 = 0;
  local_150 = (undefined1  [8])&PTR__TPZManVector_01840040;
  uVar9 = sideorient->fNElements;
  if ((long)uVar9 < 0x15) {
    local_148._0_8_ = &local_130;
    local_138 = 0;
  }
  else {
    local_148._0_8_ = operator_new__(-(ulong)(uVar9 >> 0x3e != 0) | uVar9 * 4);
    local_138 = uVar9;
  }
  if (0 < (long)uVar9) {
    piVar2 = sideorient->fStore;
    uVar7 = 0;
    do {
      *(int *)(local_148._0_8_ + uVar7 * 4) = piVar2[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar9 != uVar7);
  }
  local_148._8_8_ = uVar9;
  TPZManVector<int,_20>::operator=(&data->fSideOrient,(TPZManVector<int,_20> *)local_150);
  pTVar5 = local_158;
  if ((undefined8 *)local_148._0_8_ == &local_130) {
    local_148._0_8_ = (long *)0x0;
  }
  local_138 = 0;
  local_150 = (undefined1  [8])&PTR__TPZVec_0183b5b0;
  if ((long *)local_148._0_8_ != (long *)0x0) {
    operator_delete__((void *)local_148._0_8_);
  }
  iVar10 = pTVar5->fStore[6] + 1;
  TPZVec<int>::TPZVec((TPZVec<int> *)local_150,0);
  local_150 = (undefined1  [8])&PTR__TPZManVector_01840098;
  local_148._8_8_ = 0x13;
  local_148._0_8_ = &local_130;
  local_138 = 0;
  lVar6 = 0xb;
  auVar11 = _DAT_014f8b30;
  auVar13 = _DAT_014f8340;
  do {
    if (SUB164(auVar13 ^ _DAT_014f8350,4) == -0x80000000 &&
        SUB164(auVar13 ^ _DAT_014f8350,0) < -0x7fffffed) {
      *(int *)((long)&local_160 + lVar6 * 4 + 4) = iVar10;
      *(int *)((long)&local_158 + lVar6 * 4) = iVar10;
    }
    if (SUB164(auVar11 ^ _DAT_014f8350,4) == -0x80000000 &&
        SUB164(auVar11 ^ _DAT_014f8350,0) < -0x7fffffed) {
      *(int *)((long)&local_158 + lVar6 * 4 + 4) = iVar10;
      *(int *)(local_148 + lVar6 * 4 + -8) = iVar10;
    }
    lVar12 = auVar13._8_8_;
    auVar13._0_8_ = auVar13._0_8_ + 4;
    auVar13._8_8_ = lVar12 + 4;
    lVar12 = auVar11._8_8_;
    auVar11._0_8_ = auVar11._0_8_ + 4;
    auVar11._8_8_ = lVar12 + 4;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x1f);
  local_160 = &PTR__TPZVec_0183b5b0;
  TPZShapeH1<pzshape::TPZShapeCube>::Initialize
            (&(data->fCornerNodeIds).super_TPZVec<long>,(TPZVec<int> *)local_150,data);
  pTVar5 = local_158;
  if (local_158->fNElements == 7) {
    stack0xffffffffffffff48 = (undefined1  [16])0x0;
    local_a8 = 0;
    local_c0._0_8_ = &PTR__TPZManVector_01840098;
    uVar9 = local_158->fNElements;
    if ((long)uVar9 < 0x1c) {
      local_c0._8_8_ = local_a0;
      local_a8 = 0;
    }
    else {
      local_c0._8_8_ = operator_new__(-(ulong)(uVar9 >> 0x3e != 0) | uVar9 * 4);
      local_a8 = uVar9;
    }
    if (0 < (long)uVar9) {
      piVar2 = pTVar5->fStore;
      uVar7 = 0;
      do {
        *(int *)(local_c0._8_8_ + uVar7 * 4) = piVar2[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar9 != uVar7);
    }
    uStack_b0 = uVar9;
    TPZManVector<int,_27>::operator=(&data->fHDivConnectOrders,(TPZManVector<int,_27> *)local_c0);
    if ((int *)local_c0._8_8_ == local_a0) {
      local_c0._8_8_ = (int *)0x0;
    }
    local_a8 = 0;
    local_c0._0_8_ = &PTR__TPZVec_0183b5b0;
    if ((int *)local_c0._8_8_ != (int *)0x0) {
      operator_delete__((void *)local_c0._8_8_);
    }
    TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,7);
    piVar2 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore;
    piVar3 = (data->fHDivNumConnectShape).super_TPZVec<int>.fStore;
    lVar6 = 0;
    iVar10 = 0;
    do {
      iVar8 = piVar2[lVar6];
      if (lVar6 == 6) {
        iVar8 = iVar8 * (iVar8 + 1) * (iVar8 + 1) * 3;
      }
      else {
        iVar8 = (iVar8 + 1) * (iVar8 + 1);
      }
      piVar3[lVar6] = iVar8;
      iVar10 = iVar10 + iVar8;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
    TPZManVector<std::pair<int,_long>,_60>::Resize(&data->fSDVecShapeIndex,(long)iVar10);
    ComputeMasterDirections(data);
    ComputeVecandShape(data);
    iVar10 = (int)(data->fHDivConnectOrders).super_TPZVec<int>.fNElements;
    if (1 < (long)iVar10) {
      uVar9 = 0;
      do {
        if ((data->fHDivConnectOrders).super_TPZVec<int>.fStore[(long)iVar10 + -1] <
            (data->fHDivConnectOrders).super_TPZVec<int>.fStore[uVar9]) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
                     ,0x3e);
        }
        uVar9 = uVar9 + 1;
      } while (iVar10 - 1 != uVar9);
    }
    if ((undefined8 *)local_148._0_8_ == &local_130) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_148._8_8_;
      local_148 = auVar4 << 0x40;
    }
    local_138 = 0;
    local_150 = (undefined1  [8])local_160;
    if ((long *)local_148._0_8_ != (long *)0x0) {
      operator_delete__((void *)local_148._0_8_);
    }
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
             ,0x26);
}

Assistant:

void TPZShapeHDiv<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                      const TPZVec<int> &connectorders,
                                      const TPZVec<int>& sideorient,
                                      TPZShapeData &data)
{
    
        
    data.fCornerNodeIds = ids;
    data.fSideOrient = sideorient;
    const int ncon = TSHAPE::NFacets+1;
    //data.fHDivConnectOrders = connectorders;TODOPHIL
    int scalarorder = connectorders[TSHAPE::NFacets]+1;
    TPZManVector<int,27> scalarOrders(TSHAPE::NSides-TSHAPE::NCornerNodes,scalarorder);
    

    TPZShapeH1<TSHAPE>::Initialize(data.fCornerNodeIds, scalarOrders, data);
    if(connectorders.size() != TSHAPE::NFacets+1) DebugStop();
    
    data.fHDivConnectOrders = connectorders;

    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    int nShape = 0;
    for (int i = 0; i < TSHAPE::NFacets+1; i++)
    {
        int order = data.fHDivConnectOrders[i];
        data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,order);
        nShape += data.fHDivNumConnectShape[i];
    }
    
    data.fSDVecShapeIndex.Resize(nShape);

    ComputeMasterDirections(data);
    ComputeVecandShape(data);
    
    //Checks if the last connect order is >= then the other connects
    int size = data.fHDivConnectOrders.size();
    int maxOrder = data.fHDivConnectOrders[size-1];
    for (int i = 0; i < size-1; i++)
    {
        if (data.fHDivConnectOrders[i] > maxOrder){
            DebugStop();
        }
    }    
}